

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DGXMLScanner::scanEndTag(DGXMLScanner *this,bool *gotData)

{
  MemoryManager *pMVar1;
  XMLValidator *pXVar2;
  XMLDocumentHandler *pXVar3;
  _func_int **pp_Var4;
  byte bVar5;
  bool bVar6;
  ModelTypes MVar7;
  uint uVar8;
  RuntimeException *this_00;
  XMLCh *pXVar9;
  MemoryManager *pMVar10;
  XMLCh *text2;
  QName *this_01;
  XMLCh *local_c8;
  uint local_64;
  ulong uStack_48;
  bool res;
  XMLSize_t failure;
  XMLElementDecl *pXStack_38;
  bool isRoot;
  XMLElementDecl *tempElement;
  StackElem *topElem;
  uint uriId;
  bool *local_18;
  bool *gotData_local;
  DGXMLScanner *this_local;
  
  *gotData = true;
  local_18 = gotData;
  gotData_local = (bool *)this;
  bVar6 = ElemStack::isEmpty(&(this->super_XMLScanner).fElemStack);
  if (bVar6) {
    XMLScanner::emitError(&this->super_XMLScanner,MoreEndThanStartTags);
    ReaderMgr::skipPastChar(&(this->super_XMLScanner).fReaderMgr,L'>');
    this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
    RuntimeException::RuntimeException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
               ,0x24f,Scan_UnbalancedStartEnd,(this->super_XMLScanner).fMemoryManager);
    __cxa_throw(this_00,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
  }
  if (((this->super_XMLScanner).fDoNamespaces & 1U) == 0) {
    local_64 = (this->super_XMLScanner).fEmptyNamespaceId;
  }
  else {
    local_64 = ElemStack::getCurrentURI(&(this->super_XMLScanner).fElemStack);
  }
  topElem._0_4_ = local_64;
  tempElement = (XMLElementDecl *)ElemStack::popTop(&(this->super_XMLScanner).fElemStack);
  pXStack_38 = ((StackElem *)tempElement)->fThisElement;
  failure._7_1_ = ElemStack::isEmpty(&(this->super_XMLScanner).fElemStack);
  pXVar9 = XMLElementDecl::getFullName(pXStack_38);
  bVar6 = ReaderMgr::skippedStringLong(&(this->super_XMLScanner).fReaderMgr,pXVar9);
  if (bVar6) {
    pMVar1 = tempElement->fMemoryManager;
    pMVar10 = (MemoryManager *)ReaderMgr::getCurrentReaderNum(&(this->super_XMLScanner).fReaderMgr);
    if (pMVar1 != pMVar10) {
      XMLScanner::emitError(&this->super_XMLScanner,PartialTagMarkupError);
    }
    ReaderMgr::skipPastSpaces(&(this->super_XMLScanner).fReaderMgr);
    bVar6 = ReaderMgr::skippedChar(&(this->super_XMLScanner).fReaderMgr,L'>');
    if (!bVar6) {
      pXVar9 = XMLElementDecl::getFullName
                         ((XMLElementDecl *)(tempElement->super_XSerializable)._vptr_XSerializable);
      XMLScanner::emitError
                (&this->super_XMLScanner,UnterminatedEndTag,pXVar9,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    if (((this->super_XMLScanner).fValidate & 1U) != 0) {
      if ((((ulong)tempElement[1].fElementName & 0x100) != 0) &&
         (MVar7 = DTDElementDecl::getModelType
                            ((DTDElementDecl *)
                             (tempElement->super_XSerializable)._vptr_XSerializable), MVar7 == Empty
         )) {
        pXVar2 = (this->super_XMLScanner).fValidator;
        pXVar9 = XMLElementDecl::getFullName
                           ((XMLElementDecl *)(tempElement->super_XSerializable)._vptr_XSerializable
                           );
        XMLValidator::emitError
                  (pXVar2,EmptyElemHasContent,pXVar9,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      }
      if ((((ulong)tempElement[1].fElementName & 0x10000) != 0) &&
         (MVar7 = DTDElementDecl::getModelType
                            ((DTDElementDecl *)
                             (tempElement->super_XSerializable)._vptr_XSerializable),
         MVar7 == Children)) {
        pXVar2 = (this->super_XMLScanner).fValidator;
        pXVar9 = XMLElementDecl::getFullName
                           ((XMLElementDecl *)(tempElement->super_XSerializable)._vptr_XSerializable
                           );
        XMLValidator::emitError
                  (pXVar2,ElemChildrenHasInvalidWS,pXVar9,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      }
      pXVar2 = (this->super_XMLScanner).fValidator;
      uVar8 = (*pXVar2->_vptr_XMLValidator[2])
                        (pXVar2,(tempElement->super_XSerializable)._vptr_XSerializable,
                         tempElement->fId,*(undefined8 *)&tempElement->fCreateReason,
                         &stack0xffffffffffffffb8);
      if ((uVar8 & 1) == 0) {
        if (*(long *)&tempElement->fCreateReason == 0) {
          pXVar2 = (this->super_XMLScanner).fValidator;
          pXVar9 = (XMLCh *)(**(code **)(*(tempElement->super_XSerializable)._vptr_XSerializable +
                                        0x68))();
          XMLValidator::emitError
                    (pXVar2,EmptyNotValidForContent,pXVar9,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        }
        else if (uStack_48 < *(ulong *)&tempElement->fCreateReason) {
          pXVar2 = (this->super_XMLScanner).fValidator;
          pXVar9 = QName::getRawName(*(QName **)(tempElement->fId + uStack_48 * 8));
          text2 = (XMLCh *)(**(code **)(*(tempElement->super_XSerializable)._vptr_XSerializable +
                                       0x68))();
          XMLValidator::emitError
                    (pXVar2,ElementNotValidForContent,pXVar9,text2,(XMLCh *)0x0,(XMLCh *)0x0);
        }
        else {
          pXVar2 = (this->super_XMLScanner).fValidator;
          pXVar9 = (XMLCh *)(**(code **)(*(tempElement->super_XSerializable)._vptr_XSerializable +
                                        0x68))();
          XMLValidator::emitError
                    (pXVar2,NotEnoughElemsForCM,pXVar9,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        }
      }
    }
    uVar8 = (uint)topElem;
    bVar5 = failure._7_1_;
    if ((this->super_XMLScanner).fDocHandler != (XMLDocumentHandler *)0x0) {
      pXVar3 = (this->super_XMLScanner).fDocHandler;
      pp_Var4 = (tempElement->super_XSerializable)._vptr_XSerializable;
      if (((this->super_XMLScanner).fDoNamespaces & 1U) == 0) {
        local_c8 = L"";
      }
      else {
        this_01 = XMLElementDecl::getElementName
                            ((XMLElementDecl *)
                             (tempElement->super_XSerializable)._vptr_XSerializable);
        local_c8 = QName::getPrefix(this_01);
      }
      (*pXVar3->_vptr_XMLDocumentHandler[6])
                (pXVar3,pp_Var4,(ulong)uVar8,(ulong)(bVar5 & 1),local_c8);
    }
    *local_18 = (bool)((failure._7_1_ ^ 0xff) & 1);
  }
  else {
    pXVar9 = XMLElementDecl::getFullName(pXStack_38);
    XMLScanner::emitError
              (&this->super_XMLScanner,ExpectedEndOfTagX,pXVar9,(XMLCh *)0x0,(XMLCh *)0x0,
               (XMLCh *)0x0);
    ReaderMgr::skipPastChar(&(this->super_XMLScanner).fReaderMgr,L'>');
  }
  return;
}

Assistant:

void DGXMLScanner::scanEndTag(bool& gotData)
{
    //  Assume we will still have data until proven otherwise. It will only
    //  ever be false if this is the end of the root element.
    gotData = true;

    //  Check if the element stack is empty. If so, then this is an unbalanced
    //  element (i.e. more ends than starts, perhaps because of bad text
    //  causing one to be skipped.)
    if (fElemStack.isEmpty())
    {
        emitError(XMLErrs::MoreEndThanStartTags);
        fReaderMgr.skipPastChar(chCloseAngle);
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Scan_UnbalancedStartEnd, fMemoryManager);
    }

    //  Pop the stack of the element we are supposed to be ending. Remember
    //  that we don't own this. The stack just keeps them and reuses them.
    unsigned int uriId = (fDoNamespaces)
        ? fElemStack.getCurrentURI() : fEmptyNamespaceId;

    //  Pop the stack of the element we are supposed to be ending. Remember
    //  that we don't own this. The stack just keeps them and reuses them.
    const ElemStack::StackElem* topElem = fElemStack.popTop();
    XMLElementDecl *tempElement = topElem->fThisElement;

    // See if it was the root element, to avoid multiple calls below
    const bool isRoot = fElemStack.isEmpty();

    // Make sure that its the end of the element that we expect
    if (!fReaderMgr.skippedStringLong(tempElement->getFullName()))
    {
        emitError
        (
            XMLErrs::ExpectedEndOfTagX
            , tempElement->getFullName()
        );
        fReaderMgr.skipPastChar(chCloseAngle);
        return;
    }

    // Make sure we are back on the same reader as where we started
    if (topElem->fReaderNum != fReaderMgr.getCurrentReaderNum())
        emitError(XMLErrs::PartialTagMarkupError);

    // Skip optional whitespace
    fReaderMgr.skipPastSpaces();

    // Make sure we find the closing bracket
    if (!fReaderMgr.skippedChar(chCloseAngle))
    {
        emitError
        (
            XMLErrs::UnterminatedEndTag
            , topElem->fThisElement->getFullName()
        );
    }

    //  If validation is enabled, then lets pass him the list of children and
    //  this element and let him validate it.
    if (fValidate)
    {

       //
       // XML1.0-3rd
       // Validity Constraint:
       // The declaration matches EMPTY and the element has no content (not even
       // entity references, comments, PIs or white space).
       //
       if ( (topElem->fCommentOrPISeen)               &&
            (((DTDElementDecl*) topElem->fThisElement)->getModelType() == DTDElementDecl::Empty))
       {
           fValidator->emitError
               (
               XMLValid::EmptyElemHasContent
               , topElem->fThisElement->getFullName()
               );
       }

       //
       // XML1.0-3rd
       // Validity Constraint:
       //
       // The declaration matches children and the sequence of child elements
       // belongs to the language generated by the regular expression in the
       // content model, with optional white space, comments and PIs
       // (i.e. markup matching production [27] Misc) between the start-tag and
       // the first child element, between child elements, or between the last
       // child element and the end-tag.
       //
       // Note that
       //    a CDATA section containing only white space or
       //    a reference to an entity whose replacement text is character references
       //       expanding to white space do not match the nonterminal S, and hence
       //       cannot appear in these positions; however,
       //    a reference to an internal entity with a literal value consisting
       //       of character references expanding to white space does match S,
       //       since its replacement text is the white space resulting from expansion
       //       of the character references.
       //
       if ( (topElem->fReferenceEscaped)               &&
            (((DTDElementDecl*) topElem->fThisElement)->getModelType() == DTDElementDecl::Children))
       {
           fValidator->emitError
               (
               XMLValid::ElemChildrenHasInvalidWS
               , topElem->fThisElement->getFullName()
               );
       }

        XMLSize_t failure;
        bool res = fValidator->checkContent
        (
            topElem->fThisElement
            , topElem->fChildren
            , topElem->fChildCount
            , &failure
        );

        if (!res)
        {
            //  One of the elements is not valid for the content. NOTE that
            //  if no children were provided but the content model requires
            //  them, it comes back with a zero value. But we cannot use that
            //  to index the child array in this case, and have to put out a
            //  special message.
            if (!topElem->fChildCount)
            {
                fValidator->emitError
                (
                    XMLValid::EmptyNotValidForContent
                    , topElem->fThisElement->getFormattedContentModel()
                );
            }
            else if (failure >= topElem->fChildCount)
            {
                fValidator->emitError
                (
                    XMLValid::NotEnoughElemsForCM
                    , topElem->fThisElement->getFormattedContentModel()
                );
            }
            else
            {
                fValidator->emitError
                (
                    XMLValid::ElementNotValidForContent
                    , topElem->fChildren[failure]->getRawName()
                    , topElem->fThisElement->getFormattedContentModel()
                );
            }
        }
    }

    // If we have a doc handler, tell it about the end tag
    if (fDocHandler)
    {
        fDocHandler->endElement
        (
            *topElem->fThisElement
            , uriId
            , isRoot
            , (fDoNamespaces)
                ? topElem->fThisElement->getElementName()->getPrefix()
                : XMLUni::fgZeroLenString
        );
    }

    // If this was the root, then done with content
    gotData = !isRoot;
}